

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector_ImWchar_conflict1 *out_ranges)

{
  uint uVar1;
  wchar_t wVar2;
  ImWchar *pIVar3;
  wchar_t wVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  wchar_t wVar10;
  
  uVar8 = 0;
  do {
    if (((int)uVar8 >> 5 < 0) || ((this->UsedChars).Size <= (int)uVar8 >> 5)) {
LAB_001d2af8:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x707,
                    "const T &ImVector<unsigned int>::operator[](int) const [T = unsigned int]");
    }
    uVar5 = (ulong)(int)uVar8;
    uVar9 = uVar8;
    if ((*(uint *)((long)(this->UsedChars).Data + (uVar5 >> 3 & 0x1fffffffc)) >> (uVar8 & 0x1f) & 1)
        != 0) {
      wVar2 = out_ranges->Capacity;
      if (out_ranges->Size == wVar2) {
        if (wVar2 == L'\0') {
          wVar4 = L'\b';
        }
        else {
          wVar4 = wVar2 / 2 + wVar2;
        }
        wVar10 = out_ranges->Size + L'\x01';
        if (wVar10 < wVar4) {
          wVar10 = wVar4;
        }
        if (wVar2 < wVar10) {
          pIVar3 = (ImWchar *)ImGui::MemAlloc((long)wVar10 * 2);
          if (out_ranges->Data != (ImWchar *)0x0) {
            memcpy(pIVar3,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = pIVar3;
          out_ranges->Capacity = wVar10;
        }
      }
      out_ranges->Data[out_ranges->Size] = (ImWchar)uVar8;
      wVar4 = out_ranges->Size;
      wVar2 = wVar4 + L'\x01';
      out_ranges->Size = wVar2;
      uVar6 = 0xffff;
      if (0xffff < (int)uVar8) {
        uVar6 = uVar8;
      }
      uVar8 = uVar8 - 1;
      do {
        uVar9 = uVar6;
        if (0xfffe < (long)uVar5) break;
        iVar7 = (int)(uVar8 + 2) >> 5;
        if ((iVar7 < 0) || ((this->UsedChars).Size <= iVar7)) goto LAB_001d2af8;
        uVar5 = uVar5 + 1;
        uVar1 = uVar8 + 2;
        uVar9 = uVar8 + 1;
        uVar8 = uVar9;
      } while ((*(uint *)((long)(this->UsedChars).Data + (uVar5 >> 3 & 0x1fffffffc)) >>
                (uVar1 & 0x1f) & 1) != 0);
      wVar10 = out_ranges->Capacity;
      if (wVar2 == wVar10) {
        if (wVar10 == L'\0') {
          wVar2 = L'\b';
        }
        else {
          wVar2 = wVar10 / 2 + wVar10;
        }
        wVar4 = wVar4 + L'\x02';
        if (wVar4 < wVar2) {
          wVar4 = wVar2;
        }
        if (wVar10 < wVar4) {
          pIVar3 = (ImWchar *)ImGui::MemAlloc((long)wVar4 * 2);
          if (out_ranges->Data != (ImWchar *)0x0) {
            memcpy(pIVar3,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = pIVar3;
          out_ranges->Capacity = wVar4;
        }
      }
      out_ranges->Data[out_ranges->Size] = (ImWchar)uVar9;
      out_ranges->Size = out_ranges->Size + L'\x01';
    }
    uVar8 = uVar9 + 1;
    if (0xfffe < (int)uVar9) {
      wVar2 = out_ranges->Capacity;
      if (out_ranges->Size == wVar2) {
        wVar4 = out_ranges->Size + L'\x01';
        if (wVar2 == L'\0') {
          wVar10 = L'\b';
        }
        else {
          wVar10 = wVar2 / 2 + wVar2;
        }
        if (wVar4 < wVar10) {
          wVar4 = wVar10;
        }
        if (wVar2 < wVar4) {
          pIVar3 = (ImWchar *)ImGui::MemAlloc((long)wVar4 * 2);
          if (out_ranges->Data != (ImWchar *)0x0) {
            memcpy(pIVar3,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = pIVar3;
          out_ranges->Capacity = wVar4;
        }
      }
      out_ranges->Data[out_ranges->Size] = 0;
      out_ranges->Size = out_ranges->Size + L'\x01';
      return;
    }
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}